

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O1

Result<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::makeConst<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
          (Result<wasm::WATParser::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx,Index pos,
          Type type)

{
  undefined8 *puVar1;
  optional<int> oVar2;
  optional<float> oVar3;
  undefined4 in_register_00000014;
  _Alloc_hider _Var4;
  optional<double> oVar5;
  optional<long> oVar6;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  Err local_40;
  
  if (6 < CONCAT44(in_register_00000014,pos)) {
    __assert_fail("type.isBasic()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wat-parser.cpp"
                  ,0xc1a,
                  "Result<typename Ctx::InstrT> wasm::WATParser::(anonymous namespace)::makeConst(Ctx &, Index, Type) [Ctx = wasm::WATParser::(anonymous namespace)::ParseDeclsCtx]"
                 );
  }
  switch(pos) {
  case 2:
    oVar2 = ParseInput::takeI32(&ctx->in);
    if (((ulong)oVar2.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int> >> 0x20 & 1) != 0) {
LAB_00a1821b:
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20) =
           '\0';
      return __return_storage_ptr__;
    }
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"expected i32","");
    ParseInput::err(&local_40,&ctx->in,&local_e0);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x10)
    ;
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> = puVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.msg._M_dataplus._M_p == &local_40.msg.field_2) {
      *puVar1 = CONCAT71(local_40.msg.field_2._M_allocated_capacity._1_7_,
                         local_40.msg.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x18) =
           local_40.msg.field_2._8_8_;
    }
    else {
      *(pointer *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
        .super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> =
           local_40.msg._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                0x10) =
           CONCAT71(local_40.msg.field_2._M_allocated_capacity._1_7_,
                    local_40.msg.field_2._M_local_buf[0]);
    }
    *(size_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 8) =
         local_40.msg._M_string_length;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20) =
         '\x01';
    local_60.field_2._M_allocated_capacity = local_e0.field_2._M_allocated_capacity;
    _Var4._M_p = local_e0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p == &local_e0.field_2) {
      return __return_storage_ptr__;
    }
    break;
  case 3:
    oVar6 = ParseInput::takeI64(&ctx->in);
    if (((undefined1  [16])
         oVar6.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
        & (undefined1  [16])0x1) != (undefined1  [16])0x0) goto LAB_00a1821b;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"expected i64","");
    ParseInput::err(&local_40,&ctx->in,&local_c0);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x10)
    ;
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> = puVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.msg._M_dataplus._M_p == &local_40.msg.field_2) {
      *puVar1 = CONCAT71(local_40.msg.field_2._M_allocated_capacity._1_7_,
                         local_40.msg.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x18) =
           local_40.msg.field_2._8_8_;
    }
    else {
      *(pointer *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
        .super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> =
           local_40.msg._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                0x10) =
           CONCAT71(local_40.msg.field_2._M_allocated_capacity._1_7_,
                    local_40.msg.field_2._M_local_buf[0]);
    }
    *(size_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 8) =
         local_40.msg._M_string_length;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20) =
         '\x01';
    local_60.field_2._M_allocated_capacity = local_c0.field_2._M_allocated_capacity;
    _Var4._M_p = local_c0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p == &local_c0.field_2) {
      return __return_storage_ptr__;
    }
    break;
  case 4:
    oVar3 = ParseInput::takeF32(&ctx->in);
    if (((ulong)oVar3.super__Optional_base<float,_true,_true>._M_payload.
                super__Optional_payload_base<float> >> 0x20 & 1) != 0) goto LAB_00a1821b;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"expected f32","");
    ParseInput::err(&local_40,&ctx->in,&local_a0);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x10)
    ;
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> = puVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.msg._M_dataplus._M_p == &local_40.msg.field_2) {
      *puVar1 = CONCAT71(local_40.msg.field_2._M_allocated_capacity._1_7_,
                         local_40.msg.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x18) =
           local_40.msg.field_2._8_8_;
    }
    else {
      *(pointer *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
        .super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> =
           local_40.msg._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                0x10) =
           CONCAT71(local_40.msg.field_2._M_allocated_capacity._1_7_,
                    local_40.msg.field_2._M_local_buf[0]);
    }
    *(size_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 8) =
         local_40.msg._M_string_length;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20) =
         '\x01';
    local_60.field_2._M_allocated_capacity = local_a0.field_2._M_allocated_capacity;
    _Var4._M_p = local_a0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p == &local_a0.field_2) {
      return __return_storage_ptr__;
    }
    break;
  case 5:
    oVar5 = ParseInput::takeF64(&ctx->in);
    if (((undefined1  [16])
         oVar5.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double> & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    goto LAB_00a1821b;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              (oVar5.super__Optional_base<double,_true,_true>._M_payload.
               super__Optional_payload_base<double>._M_payload._0_4_,&local_80,"expected f64","");
    ParseInput::err(&local_40,&ctx->in,&local_80);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x10)
    ;
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> = puVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.msg._M_dataplus._M_p == &local_40.msg.field_2) {
      *puVar1 = CONCAT71(local_40.msg.field_2._M_allocated_capacity._1_7_,
                         local_40.msg.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x18) =
           local_40.msg.field_2._8_8_;
    }
    else {
      *(pointer *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
        .super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> =
           local_40.msg._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                0x10) =
           CONCAT71(local_40.msg.field_2._M_allocated_capacity._1_7_,
                    local_40.msg.field_2._M_local_buf[0]);
    }
    *(size_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 8) =
         local_40.msg._M_string_length;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20) =
         '\x01';
    local_60.field_2._M_allocated_capacity = local_80.field_2._M_allocated_capacity;
    _Var4._M_p = local_80._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) {
      return __return_storage_ptr__;
    }
    break;
  case 6:
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"unimplemented instruction","");
    ParseInput::err(&local_40,&ctx->in,&local_60);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x10)
    ;
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> = puVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.msg._M_dataplus._M_p == &local_40.msg.field_2) {
      *puVar1 = CONCAT71(local_40.msg.field_2._M_allocated_capacity._1_7_,
                         local_40.msg.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x18) =
           local_40.msg.field_2._8_8_;
    }
    else {
      *(pointer *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
        .super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> =
           local_40.msg._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                0x10) =
           CONCAT71(local_40.msg.field_2._M_allocated_capacity._1_7_,
                    local_40.msg.field_2._M_local_buf[0]);
    }
    *(size_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 8) =
         local_40.msg._M_string_length;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20) =
         '\x01';
    _Var4._M_p = local_60._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == &local_60.field_2) {
      return __return_storage_ptr__;
    }
    break;
  default:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wat-parser.cpp"
                       ,0xc36);
  }
  local_40.msg._M_dataplus._M_p = (pointer)&local_40.msg.field_2;
  local_40.msg.field_2._M_local_buf[0] = '\0';
  local_40.msg._M_string_length = 0;
  operator_delete(_Var4._M_p,local_60.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::InstrT> makeConst(Ctx& ctx, Index pos, Type type) {
  assert(type.isBasic());
  switch (type.getBasic()) {
    case Type::i32:
      if (auto c = ctx.in.takeI32()) {
        return ctx.makeI32Const(pos, *c);
      }
      return ctx.in.err("expected i32");
    case Type::i64:
      if (auto c = ctx.in.takeI64()) {
        return ctx.makeI64Const(pos, *c);
      }
      return ctx.in.err("expected i64");
    case Type::f32:
      if (auto c = ctx.in.takeF32()) {
        return ctx.makeF32Const(pos, *c);
      }
      return ctx.in.err("expected f32");
    case Type::f64:
      if (auto c = ctx.in.takeF64()) {
        return ctx.makeF64Const(pos, *c);
      }
      return ctx.in.err("expected f64");
    case Type::v128:
      return ctx.in.err("unimplemented instruction");
    case Type::none:
    case Type::unreachable:
      break;
  }
  WASM_UNREACHABLE("unexpected type");
}